

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

char * Prs_CreateDetectRamPort(Prs_Ntk_t *pNtk,Vec_Int_t *vBox,int NameRamId)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (1 < vBox->nSize) {
    uVar4 = 0;
    do {
      if (vBox->pArray[uVar4] == NameRamId) {
        uVar1 = *(uint *)((long)vBox->pArray + ((uVar4 & 0xffffffff) << 2 | 4));
        if (-1 < (int)uVar1) {
          pcVar3 = Abc_NamStr(pNtk->pStrs,uVar1 >> 2);
          return pcVar3;
        }
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x13d,"int Abc_Lit2Var2(int)");
      }
      iVar2 = (int)uVar4;
      uVar4 = uVar4 + 2;
    } while (iVar2 + 3 < vBox->nSize);
  }
  return (char *)0x0;
}

Assistant:

char * Prs_CreateDetectRamPort( Prs_Ntk_t * pNtk, Vec_Int_t * vBox, int NameRamId )
{
    int i, FormId, ActId;
    Vec_IntForEachEntryDouble( vBox, FormId, ActId, i )
        if ( FormId == NameRamId )
            return Abc_NamStr(pNtk->pStrs, Abc_Lit2Var2(ActId));
    return NULL;
}